

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void __thiscall JsonArray_TooDeeplyNested_Test::TestBody(JsonArray_TooDeeplyNested_Test *this)

{
  parser<json_out_callbacks> *this_00;
  char *message;
  AssertHelper AStack_138;
  error_code local_130;
  AssertionResult gtest_ar;
  undefined1 local_110 [16];
  json_out_callbacks local_100;
  result_type local_e0;
  parser<json_out_callbacks> p;
  
  local_100.out_._M_dataplus._M_p = (pointer)&local_100.out_.field_2;
  local_100.out_.field_2._M_allocated_capacity = 0;
  local_100.out_.field_2._8_8_ = 0;
  local_100.out_._M_string_length = 0;
  pstore::json::parser<json_out_callbacks>::parser(&p,&local_100,none);
  std::__cxx11::string::~string((string *)&local_100);
  gtest_ar._0_8_ = local_110;
  std::__cxx11::string::_M_construct((ulong)&gtest_ar,-0x38);
  this_00 = pstore::json::parser<json_out_callbacks>::input(&p,(string *)&gtest_ar);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_e0,this_00);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  local_130._M_cat = pstore::json::get_error_category();
  local_130._M_value = 0xe;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"p.last_error ()",
             "make_error_code (json::error_code::nesting_too_deep)",&p.error_,&local_130);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_130);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xff,message);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    if ((long *)CONCAT44(local_130._4_4_,local_130._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_130._4_4_,local_130._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<json_out_callbacks>::~parser(&p);
  return;
}

Assistant:

TEST_F (JsonArray, TooDeeplyNested) {
    json::parser<json_out_callbacks> p;
    p.input (std::string (std::string::size_type{200}, '[')).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::nesting_too_deep));
}